

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

uint __thiscall trompeloeil::sequence_handler<1UL>::order(sequence_handler<1UL> *this)

{
  uint uVar1;
  uint highest_order;
  uint uVar2;
  long lVar3;
  
  uVar2 = 0;
  for (lVar3 = 0x20; lVar3 != 0x68; lVar3 = lVar3 + 0x48) {
    uVar1 = sequence_matcher::cost
                      ((sequence_matcher *)((long)(this->matchers)._M_elems + lVar3 + -0x20));
    if (uVar2 < uVar1) {
      uVar2 = uVar1;
    }
  }
  return uVar2;
}

Assistant:

unsigned
    order()
    const
    noexcept
    override
    {
      unsigned highest_order = 0U;
      for (auto& m : matchers)
      {
        auto cost = m.cost();
        if (cost > highest_order)
        {
          highest_order = cost;
        }
      }
      return highest_order;
    }